

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O2

int CVodeSetProjFrequency(void *cvode_mem,long freq)

{
  int iVar1;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  
  iVar1 = cvAccessProjMem(cvode_mem,"CVodeSetProjFrequency",&cv_mem,&proj_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (freq < 0) {
    proj_mem->freq = 1;
  }
  else {
    if (freq == 0) {
      proj_mem->freq = 0;
      iVar1 = 0;
      goto LAB_00116b7b;
    }
    proj_mem->freq = freq;
  }
  iVar1 = 1;
LAB_00116b7b:
  cv_mem->proj_enabled = iVar1;
  return 0;
}

Assistant:

int CVodeSetProjFrequency(void* cvode_mem, long int freq)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set projection frequency */
  if (freq < 0)
  {
    /* Restore default */
    proj_mem->freq       = 1;
    cv_mem->proj_enabled = SUNTRUE;
  }
  else if (freq == 0)
  {
    /* Disable projection */
    proj_mem->freq       = 0;
    cv_mem->proj_enabled = SUNFALSE;
  }
  else
  {
    /* Enable projection at given frequency */
    proj_mem->freq       = freq;
    cv_mem->proj_enabled = SUNTRUE;
  }

  return (CV_SUCCESS);
}